

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_iMultiFab.cpp
# Opt level: O2

void __thiscall
amrex::iMultiFab::plus(iMultiFab *this,iMultiFab *mf,int strt_comp,int num_comp,int nghost)

{
  Add<amrex::IArrayBox,void>
            (&this->super_FabArray<amrex::IArrayBox>,&mf->super_FabArray<amrex::IArrayBox>,strt_comp
             ,strt_comp,num_comp,nghost);
  return;
}

Assistant:

void
iMultiFab::plus (const iMultiFab& mf,
                int             strt_comp,
                int             num_comp,
                int             nghost)
{
    BL_ASSERT(boxarray == mf.boxarray);
    BL_ASSERT(strt_comp >= 0);
    BL_ASSERT(num_comp > 0);
    BL_ASSERT(strt_comp + num_comp - 1 < n_comp && strt_comp + num_comp - 1 < mf.n_comp);
    BL_ASSERT(nghost <= n_grow.min() && nghost <= mf.n_grow.min());

    amrex::Add(*this, mf, strt_comp, strt_comp, num_comp, nghost);
}